

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int dump_schema_index(tnt_schema_sval *sval)

{
  uint uVar1;
  undefined8 *puVar2;
  mh_assoc_t *pmVar3;
  uint uVar4;
  
  pmVar3 = sval->index;
  uVar1 = pmVar3->n_buckets;
  if (uVar1 == 0) {
    uVar4 = 0;
LAB_001177e3:
    if (uVar4 < uVar1) {
      do {
        puVar2 = (undefined8 *)pmVar3->p[uVar4]->data;
        printf("    %d: %s\n",(ulong)*(uint *)((long)puVar2 + 0xc),*puVar2);
        pmVar3 = sval->index;
        uVar1 = pmVar3->n_buckets;
        if (uVar4 < uVar1) {
          do {
            if (uVar1 - 1 == uVar4) {
              return 0;
            }
            uVar4 = uVar4 + 1;
          } while ((pmVar3->b[uVar4 >> 4] >> (uVar4 & 0xf) & 1) == 0);
        }
      } while (uVar4 < uVar1);
    }
  }
  else {
    uVar4 = 0;
    do {
      if ((pmVar3->b[uVar4 >> 4] >> (uVar4 & 0xf) & 1) != 0) goto LAB_001177e3;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return 0;
}

Assistant:

int dump_schema_index(struct tnt_schema_sval *sval) {
	mh_int_t ipos = 0;
	mh_foreach(sval->index, ipos) {
		struct tnt_schema_ival *ival = NULL;
		ival = (*mh_assoc_node(sval->index, ipos))->data;
		printf("    %d: %s\n", ival->number, ival->name);
	}
	return 0;
}